

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# malloc.c
# Opt level: O0

void * realloc(void *__ptr,size_t __size)

{
  int iVar1;
  int *piVar2;
  mchunkptr pmVar3;
  ulong uVar4;
  long lVar5;
  size_t local_68;
  size_t local_50;
  size_t oc;
  mchunkptr newp;
  mstate m;
  mchunkptr oldp;
  size_t nb;
  void *mem;
  size_t bytes_local;
  void *oldmem_local;
  
  iVar1 = _gm_.mutex;
  nb = 0;
  if (__ptr == (void *)0x0) {
    nb = (size_t)malloc(__size);
  }
  else if (__size < 0xffffffffffffff80) {
    if (__size < 0x17) {
      local_50 = 0x20;
    }
    else {
      local_50 = __size + 0x17 & 0xfffffffffffffff0;
    }
    if ((_gm_.mflags & 2) != 0) {
      LOCK();
      _gm_.mutex = 1;
      UNLOCK();
      if ((iVar1 != 0) && (iVar1 = spin_acquire_lock(&_gm_.mutex), iVar1 != 0)) {
        return (void *)0x0;
      }
    }
    pmVar3 = try_realloc_chunk(&_gm_,(mchunkptr)((long)__ptr + -0x10),local_50,1);
    if ((_gm_.mflags & 2) != 0) {
      _gm_.mutex = 0;
    }
    if (pmVar3 == (mchunkptr)0x0) {
      nb = (size_t)malloc(__size);
      if ((void *)nb != (void *)0x0) {
        lVar5 = 8;
        if ((*(ulong *)((long)__ptr + -8) & 3) == 0) {
          lVar5 = 0x10;
        }
        uVar4 = (*(ulong *)((long)__ptr + -8) & 0xfffffffffffffff8) - lVar5;
        local_68 = __size;
        if (uVar4 < __size) {
          local_68 = uVar4;
        }
        memcpy((void *)nb,__ptr,local_68);
        free(__ptr);
      }
    }
    else {
      nb = (size_t)&pmVar3->fd;
    }
  }
  else {
    piVar2 = _PDCLIB_errno_func();
    *piVar2 = 0xc;
  }
  return (void *)nb;
}

Assistant:

void* dlrealloc(void* oldmem, size_t bytes) {
  void* mem = 0;
  if (oldmem == 0) {
    mem = dlmalloc(bytes);
  }
  else if (bytes >= MAX_REQUEST) {
    MALLOC_FAILURE_ACTION;
  }
#ifdef REALLOC_ZERO_BYTES_FREES
  else if (bytes == 0) {
    dlfree(oldmem);
  }
#endif /* REALLOC_ZERO_BYTES_FREES */
  else {
    size_t nb = request2size(bytes);
    mchunkptr oldp = mem2chunk(oldmem);
#if ! FOOTERS
    mstate m = gm;
#else /* FOOTERS */
    mstate m = get_mstate_for(oldp);
    if (!ok_magic(m)) {
      USAGE_ERROR_ACTION(m, oldmem);
      return 0;
    }
#endif /* FOOTERS */
    if (!PREACTION(m)) {
      mchunkptr newp = try_realloc_chunk(m, oldp, nb, 1);
      POSTACTION(m);
      if (newp != 0) {
        check_inuse_chunk(m, newp);
        mem = chunk2mem(newp);
      }
      else {
        mem = internal_malloc(m, bytes);
        if (mem != 0) {
          size_t oc = chunksize(oldp) - overhead_for(oldp);
          memcpy(mem, oldmem, (oc < bytes)? oc : bytes);
          internal_free(m, oldmem);
        }
      }
    }
  }
  return mem;
}